

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

bool __thiscall re2::BitState::TrySearch(BitState *this,int id0,char *p0)

{
  char **ppcVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  InstOp IVar5;
  int iVar6;
  EmptyOp EVar7;
  EmptyOp EVar8;
  Inst *this_00;
  ostream *poVar9;
  byte *pbVar10;
  char *pcVar11;
  int local_4f4;
  undefined1 local_4f0 [4];
  int i;
  uint local_36c;
  undefined1 local_368 [4];
  int c;
  LogMessage local_1d8;
  Inst *local_58;
  Inst *ip;
  byte *pbStack_48;
  int arg;
  char *p;
  byte *pbStack_38;
  int id;
  char *end;
  bool inaltmatch;
  char *pcStack_28;
  bool matched;
  char *p0_local;
  BitState *pBStack_18;
  int id0_local;
  BitState *this_local;
  
  end._7_1_ = 0;
  end._6_1_ = 0;
  pcStack_28 = p0;
  p0_local._4_4_ = id0;
  pBStack_18 = this;
  pbStack_38 = (byte *)StringPiece::end(&this->text_);
  this->njob_ = 0;
  Push(this,p0_local._4_4_,pcStack_28,0);
LAB_0015abc2:
  do {
    if (this->njob_ < 1) {
      return (bool)(end._7_1_ & 1);
    }
    this->njob_ = this->njob_ + -1;
    p._4_4_ = this->job_[this->njob_].id;
    pbStack_48 = (byte *)this->job_[this->njob_].p;
    ip._4_4_ = this->job_[this->njob_].arg;
    do {
      local_58 = Prog::inst(this->prog_,p._4_4_);
      IVar5 = Prog::Inst::opcode(local_58);
      pbVar2 = pbStack_48;
      switch(IVar5) {
      case kInstAltMatch:
        if (ip._4_4_ != 0) {
          if (ip._4_4_ == 1) {
            end._6_1_ = 0;
          }
          else {
            LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_368,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc"
                       ,0xd4);
            poVar9 = LogMessage::stream((LogMessage *)local_368);
            poVar9 = std::operator<<(poVar9,"Bad arg in kInstAltMatch: ");
            std::ostream::operator<<(poVar9,ip._4_4_);
            LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_368);
          }
          goto LAB_0015abc2;
        }
        end._6_1_ = 1;
        Push(this,p._4_4_,(char *)pbStack_48,1);
        bVar3 = Prog::Inst::greedy(local_58,this->prog_);
        if (bVar3) {
          iVar4 = Prog::Inst::out1(local_58);
          Push(this,iVar4,(char *)pbStack_48,0);
          p._4_4_ = Prog::Inst::out1(local_58);
          pbStack_48 = pbStack_38;
        }
        else {
          iVar4 = Prog::Inst::out(local_58);
          Push(this,iVar4,(char *)pbStack_38,0);
          p._4_4_ = Prog::Inst::out(local_58);
        }
        break;
      case kInstByteRange:
        local_36c = 0xffffffff;
        if (pbStack_48 < pbStack_38) {
          local_36c = (uint)*pbStack_48;
        }
        bVar3 = Prog::Inst::Matches(local_58,local_36c);
        if (!bVar3) goto LAB_0015ac2d;
        iVar4 = Prog::Inst::last(local_58);
        if (iVar4 == 0) {
          Push(this,p._4_4_ + 1,(char *)pbStack_48,0);
        }
        p._4_4_ = Prog::Inst::out(local_58);
        pbStack_48 = pbStack_48 + 1;
        break;
      case kInstCapture:
        if (ip._4_4_ != 0) {
          if (ip._4_4_ == 1) {
            ppcVar1 = this->cap_;
            iVar4 = Prog::Inst::cap(local_58);
            ppcVar1[iVar4] = (char *)pbVar2;
          }
          else {
            LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_4f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc"
                       ,0xfa);
            poVar9 = LogMessage::stream((LogMessage *)local_4f0);
            poVar9 = std::operator<<(poVar9,"Bad arg in kInstCapture: ");
            std::ostream::operator<<(poVar9,ip._4_4_);
            LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_4f0);
          }
          goto LAB_0015abc2;
        }
        iVar4 = Prog::Inst::last(local_58);
        if (iVar4 == 0) {
          Push(this,p._4_4_ + 1,(char *)pbStack_48,0);
        }
        iVar4 = Prog::Inst::cap(local_58);
        if ((-1 < iVar4) &&
           (iVar6 = Prog::Inst::cap(local_58), iVar4 = p._4_4_, iVar6 < this->ncap_)) {
          ppcVar1 = this->cap_;
          iVar6 = Prog::Inst::cap(local_58);
          Push(this,iVar4,ppcVar1[iVar6],1);
          pbVar2 = pbStack_48;
          ppcVar1 = this->cap_;
          iVar4 = Prog::Inst::cap(local_58);
          ppcVar1[iVar4] = (char *)pbVar2;
        }
        p._4_4_ = Prog::Inst::out(local_58);
        break;
      case kInstEmptyWidth:
        EVar7 = Prog::Inst::empty(local_58);
        EVar8 = Prog::EmptyFlags(&this->context_,(char *)pbStack_48);
        if ((EVar7 & (EVar8 ^ 0xffffffff)) != 0) goto LAB_0015ac2d;
        iVar4 = Prog::Inst::last(local_58);
        if (iVar4 == 0) {
          Push(this,p._4_4_ + 1,(char *)pbStack_48,0);
        }
        p._4_4_ = Prog::Inst::out(local_58);
        break;
      case kInstMatch:
        if (((this->endmatch_ & 1U) == 0) ||
           (pbVar10 = (byte *)StringPiece::end(&this->text_), pbVar2 == pbVar10)) {
          if (this->nsubmatch_ == 0) {
            return true;
          }
          end._7_1_ = 1;
          this->cap_[1] = (char *)pbStack_48;
          pcVar11 = StringPiece::data(this->submatch_);
          pbVar2 = pbStack_48;
          if ((pcVar11 == (char *)0x0) ||
             (((this->longest_ & 1U) != 0 &&
              (pbVar10 = (byte *)StringPiece::end(this->submatch_), pbVar10 < pbVar2)))) {
            for (local_4f4 = 0; local_4f4 < this->nsubmatch_; local_4f4 = local_4f4 + 1) {
              StringPiece::set(this->submatch_ + local_4f4,this->cap_[local_4f4 << 1],
                               (int)this->cap_[local_4f4 * 2 + 1] - (int)this->cap_[local_4f4 << 1])
              ;
            }
          }
          pbVar2 = pbStack_48;
          if ((this->longest_ & 1U) == 0) {
            return true;
          }
          pbVar10 = (byte *)StringPiece::end(&this->text_);
          if (pbVar2 == pbVar10) {
            return true;
          }
        }
LAB_0015ac2d:
        this_00 = Prog::inst(this->prog_,p._4_4_);
        iVar4 = Prog::Inst::last(this_00);
        if ((iVar4 != 0) || ((end._6_1_ & 1) != 0)) goto LAB_0015abc2;
        p._4_4_ = p._4_4_ + 1;
        break;
      case kInstNop:
        iVar4 = Prog::Inst::last(local_58);
        if (iVar4 == 0) {
          Push(this,p._4_4_ + 1,(char *)pbStack_48,0);
        }
        p._4_4_ = Prog::Inst::out(local_58);
        break;
      case kInstFail:
        goto LAB_0015abc2;
      default:
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc"
                   ,0xb6);
        poVar9 = LogMessage::stream(&local_1d8);
        poVar9 = std::operator<<(poVar9,"Unexpected opcode: ");
        IVar5 = Prog::Inst::opcode(local_58);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,IVar5);
        poVar9 = std::operator<<(poVar9," arg ");
        std::ostream::operator<<(poVar9,ip._4_4_);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
        return false;
      }
      bVar3 = ShouldVisit(this,p._4_4_,(char *)pbStack_48);
    } while (bVar3);
  } while( true );
}

Assistant:

bool BitState::TrySearch(int id0, const char* p0) {
  bool matched = false;
  bool inaltmatch = false;
  const char* end = text_.end();
  njob_ = 0;
  Push(id0, p0, 0);
  while (njob_ > 0) {
    // Pop job off stack.
    --njob_;
    int id = job_[njob_].id;
    const char* p = job_[njob_].p;
    int arg = job_[njob_].arg;

    // Optimization: rather than push and pop,
    // code that is going to Push and continue
    // the loop simply updates ip, p, and arg
    // and jumps to CheckAndLoop.  We have to
    // do the ShouldVisit check that Push
    // would have, but we avoid the stack
    // manipulation.
    if (0) {
    Next:
      // If the Match of a non-greedy AltMatch failed,
      // we stop ourselves from trying the ByteRange,
      // which would steer us off the short circuit.
      if (prog_->inst(id)->last() || inaltmatch)
        continue;
      id++;

    CheckAndLoop:
      if (!ShouldVisit(id, p))
        continue;
    }

    // Visit ip, p.
    // VLOG(0) << "Job: " << ip->id() << " "
    //         << (p - text_.begin()) << " " << arg;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode: " << ip->opcode() << " arg " << arg;
        return false;

      case kInstFail:
        continue;

      case kInstAltMatch:
        switch (arg) {
          case 0:
            inaltmatch = true;
            Push(id, p, 1);  // come back when we're done

            // One opcode is ByteRange; the other leads to Match
            // (possibly via Nop or Capture).
            if (ip->greedy(prog_)) {
              // out1 is the match
              Push(ip->out1(), p, 0);
              id = ip->out1();
              p = end;
              goto CheckAndLoop;
            }
            // out is the match - non-greedy
            Push(ip->out(), end, 0);
            id = ip->out();
            goto CheckAndLoop;

          case 1:
            inaltmatch = false;
            continue;
        }
        LOG(DFATAL) << "Bad arg in kInstAltMatch: " << arg;
        continue;

      case kInstByteRange: {
        int c = -1;
        if (p < end)
          c = *p & 0xFF;
        if (!ip->Matches(c))
          goto Next;

        if (!ip->last())
          Push(id+1, p, 0);  // try the next when we're done
        id = ip->out();
        p++;
        goto CheckAndLoop;
      }

      case kInstCapture:
        switch (arg) {
          case 0:
            if (!ip->last())
              Push(id+1, p, 0);  // try the next when we're done

            if (0 <= ip->cap() && ip->cap() < ncap_) {
              // Capture p to register, but save old value.
              Push(id, cap_[ip->cap()], 1);  // come back when we're done
              cap_[ip->cap()] = p;
            }

            // Continue on.
            id = ip->out();
            goto CheckAndLoop;

          case 1:
            // Finished ip->out(); restore the old value.
            cap_[ip->cap()] = p;
            continue;
        }
        LOG(DFATAL) << "Bad arg in kInstCapture: " << arg;
        continue;

      case kInstEmptyWidth:
        if (ip->empty() & ~Prog::EmptyFlags(context_, p))
          goto Next;

        if (!ip->last())
          Push(id+1, p, 0);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstNop:
        if (!ip->last())
          Push(id+1, p, 0);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstMatch: {
        if (endmatch_ && p != text_.end())
          goto Next;

        // VLOG(0) << "Found match.";
        // We found a match.  If the caller doesn't care
        // where the match is, no point going further.
        if (nsubmatch_ == 0)
          return true;

        // Record best match so far.
        // Only need to check end point, because this entire
        // call is only considering one start position.
        matched = true;
        cap_[1] = p;
        if (submatch_[0].data() == NULL ||
            (longest_ && p > submatch_[0].end())) {
          for (int i = 0; i < nsubmatch_; i++)
            submatch_[i].set(cap_[2*i],
                             static_cast<int>(cap_[2*i+1] - cap_[2*i]));
        }

        // If going for first match, we're done.
        if (!longest_)
          return true;

        // If we used the entire text, no longer match is possible.
        if (p == text_.end())
          return true;

        // Otherwise, continue on in hope of a longer match.
        goto Next;
      }
    }
  }
  return matched;
}